

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  value_type vVar7;
  
  vVar7 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar3 = (this->right_->fadexpr_).left_;
  pFVar4 = (this->right_->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).left_;
  pFVar6 = (pFVar3->fadexpr_).right_;
  dVar1 = pFVar6->val_;
  dVar2 = pFVar5->val_;
  return vVar7 - (((pFVar5->dx_).ptr_to_data[i] * dVar1 + (pFVar6->dx_).ptr_to_data[i] * dVar2) *
                  pFVar4->val_ + dVar1 * dVar2 * (pFVar4->dx_).ptr_to_data[i]);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}